

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O1

int mapping0_inverse(vorbis_block *vb,vorbis_info_mapping *l)

{
  float fVar1;
  vorbis_info *pvVar2;
  vorbis_look_floor *pvVar3;
  _func_void_ptr_vorbis_block_ptr_vorbis_look_floor_ptr *p_Var4;
  float *pfVar5;
  vorbis_look_residue *pvVar6;
  _func_int_vorbis_block_ptr_vorbis_look_residue_ptr_float_ptr_ptr_int_ptr_int *p_Var7;
  float **ppfVar8;
  float *pfVar9;
  void *pvVar10;
  _func_int_vorbis_block_ptr_vorbis_look_floor_ptr_void_ptr_float_ptr *p_Var11;
  mdct_lookup *init;
  bool bVar12;
  void *pvVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  void *pvVar17;
  long lVar18;
  ulong uVar19;
  vorbis_block *pvVar20;
  int iVar21;
  float *pcmA;
  long lVar22;
  float *pcmM;
  int *piVar23;
  long lVar24;
  float fVar25;
  undefined8 uStack_70;
  float **local_68;
  ulong local_60;
  long local_58;
  long local_50;
  void *local_48;
  void *local_40;
  vorbis_block *local_38;
  
  pvVar2 = vb->vd->vi;
  local_40 = vb->vd->backend_state;
  local_48 = pvVar2->codec_setup;
  local_50 = *(long *)((long)local_48 + vb->W * 8);
  vb->pcmend = (int)local_50;
  uVar19 = (long)pvVar2->channels * 8 + 0xfU & 0xfffffffffffffff0;
  local_68 = (float **)((long)&local_68 - uVar19);
  uVar14 = (long)pvVar2->channels * 4 + 0xfU & 0xfffffffffffffff0;
  piVar23 = (int *)((long)local_68 - uVar14);
  lVar15 = (long)piVar23 + (-uVar19 - uVar14);
  local_58 = lVar15;
  local_38 = vb;
  if (0 < pvVar2->channels) {
    local_60 = (ulong)((local_50 << 0x20) >> 0x1e) >> 1;
    lVar24 = 0;
    do {
      pvVar20 = local_38;
      lVar16 = (long)*(int *)((long)l + (long)*(int *)((long)l + lVar24 * 4 + 4) * 4 + 0x404);
      pvVar3 = *(vorbis_look_floor **)(*(long *)((long)local_40 + 0x58) + lVar16 * 8);
      p_Var4 = _floor_P[*(int *)((long)local_48 + lVar16 * 4 + 0x528)]->inverse1;
      *(undefined8 *)(lVar15 + -8) = 0x1e3558;
      pvVar17 = (*p_Var4)(pvVar20,pvVar3);
      *(void **)(local_58 + lVar24 * 8) = pvVar17;
      *(uint *)((long)piVar23 + (lVar24 * 4 - uVar14)) = (uint)(pvVar17 != (void *)0x0);
      uVar19 = local_60;
      pfVar5 = local_38->pcm[lVar24];
      *(undefined8 *)(lVar15 + -8) = 0x1e3582;
      memset(pfVar5,0,uVar19);
      lVar24 = lVar24 + 1;
    } while (lVar24 < pvVar2->channels);
  }
  pvVar20 = local_38;
  pvVar17 = local_48;
  iVar21 = *(int *)((long)l + 0x484);
  if (0 < (long)iVar21) {
    lVar24 = 0;
    do {
      lVar16 = (long)*(int *)((long)l + lVar24 * 4 + 0x488);
      if ((*(int *)((long)piVar23 + (lVar16 * 4 - uVar14)) != 0) ||
         (*(int *)((long)piVar23 + ((long)*(int *)((long)l + lVar24 * 4 + 0x888) * 4 - uVar14)) != 0
         )) {
        *(undefined4 *)((long)piVar23 + (lVar16 * 4 - uVar14)) = 1;
        *(undefined4 *)((long)piVar23 + ((long)*(int *)((long)l + lVar24 * 4 + 0x888) * 4 - uVar14))
             = 1;
      }
      lVar24 = lVar24 + 1;
    } while (iVar21 != lVar24);
  }
  if (0 < *l) {
    uVar19 = 0;
    do {
      ppfVar8 = local_68;
      iVar21 = 0;
      if (0 < pvVar2->channels) {
        lVar24 = 0;
        iVar21 = 0;
        do {
          if (uVar19 == *(uint *)((long)l + lVar24 * 4 + 4)) {
            piVar23[iVar21] = (uint)(*(int *)((long)piVar23 + (lVar24 * 4 - uVar14)) != 0);
            ppfVar8[iVar21] = pvVar20->pcm[lVar24];
            iVar21 = iVar21 + 1;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < pvVar2->channels);
      }
      lVar24 = (long)*(int *)((long)l + uVar19 * 4 + 0x444);
      pvVar6 = *(vorbis_look_residue **)(*(long *)((long)local_40 + 0x60) + lVar24 * 8);
      p_Var7 = _residue_P[*(int *)((long)pvVar17 + lVar24 * 4 + 0x828)]->inverse;
      *(undefined8 *)(lVar15 + -8) = 0x1e3666;
      (*p_Var7)(pvVar20,pvVar6,ppfVar8,piVar23,iVar21);
      uVar19 = uVar19 + 1;
      pvVar20 = local_38;
      pvVar17 = local_48;
    } while ((long)uVar19 < (long)*l);
  }
  pvVar13 = local_40;
  lVar24 = local_58;
  lVar16 = (long)*(int *)((long)l + 0x484);
  if (0 < lVar16) {
    ppfVar8 = pvVar20->pcm;
    lVar22 = (long)(int)local_50 / 2;
    lVar18 = 1;
    if (1 < lVar22) {
      lVar18 = lVar22;
    }
    do {
      if (1 < (long)(int)local_50) {
        pfVar5 = ppfVar8[*(int *)((long)l + lVar16 * 4 + 0x484)];
        pfVar9 = ppfVar8[*(int *)((long)l + lVar16 * 4 + 0x884)];
        lVar22 = 0;
        do {
          fVar25 = pfVar5[lVar22];
          fVar1 = pfVar9[lVar22];
          if (fVar25 <= 0.0) {
            if (0.0 < fVar1) {
              fVar25 = fVar25 + fVar1;
              goto LAB_001e36fb;
            }
            pfVar9[lVar22] = fVar25;
            pfVar5[lVar22] = fVar25 - fVar1;
          }
          else if (fVar1 <= 0.0) {
            pfVar9[lVar22] = fVar25;
            pfVar5[lVar22] = fVar1 + fVar25;
          }
          else {
            fVar25 = fVar25 - fVar1;
LAB_001e36fb:
            pfVar9[lVar22] = fVar25;
          }
          lVar22 = lVar22 + 1;
        } while (lVar18 != lVar22);
      }
      bVar12 = 1 < lVar16;
      lVar16 = lVar16 + -1;
    } while (bVar12);
  }
  if (0 < pvVar2->channels) {
    lVar16 = 0;
    do {
      pfVar5 = pvVar20->pcm[lVar16];
      lVar18 = (long)*(int *)((long)l + (long)*(int *)((long)l + lVar16 * 4 + 4) * 4 + 0x404);
      pvVar3 = *(vorbis_look_floor **)(*(long *)((long)pvVar13 + 0x58) + lVar18 * 8);
      pvVar10 = *(void **)(lVar24 + lVar16 * 8);
      p_Var11 = _floor_P[*(int *)((long)pvVar17 + lVar18 * 4 + 0x528)]->inverse2;
      *(undefined8 *)(lVar15 + -8) = 0x1e3783;
      (*p_Var11)(pvVar20,pvVar3,pvVar10,pfVar5);
      lVar16 = lVar16 + 1;
      pvVar20 = local_38;
      pvVar17 = local_48;
    } while (lVar16 < pvVar2->channels);
  }
  if (0 < pvVar2->channels) {
    lVar24 = 0;
    do {
      pfVar5 = pvVar20->pcm[lVar24];
      init = (mdct_lookup *)**(undefined8 **)((long)pvVar13 + pvVar20->W * 8 + 0x10);
      *(undefined8 *)(lVar15 + -8) = 0x1e37bb;
      mdct_backward(init,pfVar5,pfVar5);
      lVar24 = lVar24 + 1;
      pvVar20 = local_38;
    } while (lVar24 < pvVar2->channels);
  }
  return 0;
}

Assistant:

static int mapping0_inverse(vorbis_block *vb,vorbis_info_mapping *l){
  vorbis_dsp_state     *vd=vb->vd;
  vorbis_info          *vi=vd->vi;
  codec_setup_info     *ci=vi->codec_setup;
  private_state        *b=vd->backend_state;
  vorbis_info_mapping0 *info=(vorbis_info_mapping0 *)l;

  int                   i,j;
  long                  n=vb->pcmend=ci->blocksizes[vb->W];

  float **pcmbundle=alloca(sizeof(*pcmbundle)*vi->channels);
  int    *zerobundle=alloca(sizeof(*zerobundle)*vi->channels);

  int   *nonzero  =alloca(sizeof(*nonzero)*vi->channels);
  void **floormemo=alloca(sizeof(*floormemo)*vi->channels);

  /* recover the spectral envelope; store it in the PCM vector for now */
  for(i=0;i<vi->channels;i++){
    int submap=info->chmuxlist[i];
    floormemo[i]=_floor_P[ci->floor_type[info->floorsubmap[submap]]]->
      inverse1(vb,b->flr[info->floorsubmap[submap]]);
    if(floormemo[i])
      nonzero[i]=1;
    else
      nonzero[i]=0;
    memset(vb->pcm[i],0,sizeof(*vb->pcm[i])*n/2);
  }

  /* channel coupling can 'dirty' the nonzero listing */
  for(i=0;i<info->coupling_steps;i++){
    if(nonzero[info->coupling_mag[i]] ||
       nonzero[info->coupling_ang[i]]){
      nonzero[info->coupling_mag[i]]=1;
      nonzero[info->coupling_ang[i]]=1;
    }
  }

  /* recover the residue into our working vectors */
  for(i=0;i<info->submaps;i++){
    int ch_in_bundle=0;
    for(j=0;j<vi->channels;j++){
      if(info->chmuxlist[j]==i){
        if(nonzero[j])
          zerobundle[ch_in_bundle]=1;
        else
          zerobundle[ch_in_bundle]=0;
        pcmbundle[ch_in_bundle++]=vb->pcm[j];
      }
    }

    _residue_P[ci->residue_type[info->residuesubmap[i]]]->
      inverse(vb,b->residue[info->residuesubmap[i]],
              pcmbundle,zerobundle,ch_in_bundle);
  }

  /* channel coupling */
  for(i=info->coupling_steps-1;i>=0;i--){
    float *pcmM=vb->pcm[info->coupling_mag[i]];
    float *pcmA=vb->pcm[info->coupling_ang[i]];

    for(j=0;j<n/2;j++){
      float mag=pcmM[j];
      float ang=pcmA[j];

      if(mag>0)
        if(ang>0){
          pcmM[j]=mag;
          pcmA[j]=mag-ang;
        }else{
          pcmA[j]=mag;
          pcmM[j]=mag+ang;
        }
      else
        if(ang>0){
          pcmM[j]=mag;
          pcmA[j]=mag+ang;
        }else{
          pcmA[j]=mag;
          pcmM[j]=mag-ang;
        }
    }
  }

  /* compute and apply spectral envelope */
  for(i=0;i<vi->channels;i++){
    float *pcm=vb->pcm[i];
    int submap=info->chmuxlist[i];
    _floor_P[ci->floor_type[info->floorsubmap[submap]]]->
      inverse2(vb,b->flr[info->floorsubmap[submap]],
               floormemo[i],pcm);
  }

  /* transform the PCM data; takes PCM vector, vb; modifies PCM vector */
  /* only MDCT right now.... */
  for(i=0;i<vi->channels;i++){
    float *pcm=vb->pcm[i];
    mdct_backward(b->transform[vb->W][0],pcm,pcm);
  }

  /* all done! */
  return(0);
}